

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_number_table.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::ValueNumberTable::AssignValueNumber(ValueNumberTable *this,Instruction *inst)

{
  IRContext *c;
  uint **ppuVar1;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  Op OVar6;
  uint32_t uVar7;
  spv_operand_type_t sVar8;
  mapped_type *pmVar9;
  DecorationManager *this_01;
  Operand *pOVar10;
  iterator iVar11;
  iterator iVar12;
  uint32_t *puVar13;
  uint **ppuVar14;
  uint32_t op;
  SmallVector<unsigned_int,_2UL> *this_02;
  uint32_t o;
  initializer_list<unsigned_int> init_list;
  uint32_t id_value;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_108;
  uint32_t local_fc;
  Operand local_f8;
  Instruction value_ins;
  SmallVector<unsigned_int,_2UL> local_58;
  
  uVar3 = GetValueNumber(this,inst);
  if (uVar3 != 0) {
    return uVar3;
  }
  bVar2 = IRContext::IsCombinatorInstruction(this->context_,inst);
  if ((((!bVar2) && (bVar2 = Instruction::IsCommonDebugInstr(inst), !bVar2)) ||
      ((uVar4 = inst->opcode_ - OpVariable, uVar4 < 0x2a &&
       ((0x20008000001U >> ((ulong)uVar4 & 0x3f) & 1) != 0)))) ||
     ((bVar2 = Instruction::IsLoad(inst), bVar2 &&
      (bVar2 = Instruction::IsReadOnlyLoad(inst), !bVar2)))) {
    uVar3 = this->next_value_number_;
    this->next_value_number_ = uVar3 + 1;
LAB_004a7c26:
    value_ins.super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase._0_4_ =
         Instruction::result_id(inst);
    pmVar9 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->id_to_value_,(key_type *)&value_ins);
    *pmVar9 = uVar3;
  }
  else {
    this_01 = IRContext::get_decoration_mgr(this->context_);
    OVar6 = inst->opcode_;
    if (OVar6 == OpCopyObject) {
      uVar3 = Instruction::result_id(inst);
      uVar5 = Instruction::GetSingleWordInOperand(inst,0);
      bVar2 = analysis::DecorationManager::HaveTheSameDecorations(this_01,uVar3,uVar5);
      if (bVar2) {
        uVar3 = Instruction::GetSingleWordInOperand(inst,0);
        uVar3 = GetValueNumber(this,uVar3);
        if (uVar3 != 0) goto LAB_004a7c26;
      }
      OVar6 = inst->opcode_;
    }
    if ((OVar6 == OpPhi) && (uVar3 = Instruction::NumInOperands(inst), uVar3 != 0)) {
      uVar3 = Instruction::result_id(inst);
      uVar5 = Instruction::GetSingleWordInOperand(inst,0);
      bVar2 = analysis::DecorationManager::HaveTheSameDecorations(this_01,uVar3,uVar5);
      if (bVar2) {
        uVar3 = Instruction::GetSingleWordInOperand(inst,0);
        uVar3 = GetValueNumber(this,uVar3);
        if (uVar3 != 0) {
          uVar5 = 2;
          do {
            uVar7 = Instruction::NumInOperands(inst);
            if (uVar7 <= uVar5) goto LAB_004a7c26;
            uVar7 = Instruction::GetSingleWordInOperand(inst,uVar5);
            uVar7 = GetValueNumber(this,uVar7);
            uVar5 = uVar5 + 2;
          } while (uVar3 == uVar7);
        }
      }
    }
    c = this->context_;
    OVar6 = inst->opcode_;
    uVar3 = Instruction::type_id(inst);
    uVar5 = Instruction::result_id(inst);
    local_f8.type = SPV_OPERAND_TYPE_NONE;
    local_f8._4_4_ = 0;
    local_f8.words._vptr_SmallVector = (_func_int **)0x0;
    local_f8.words.size_ = 0;
    Instruction::Instruction(&value_ins,c,OVar6,uVar3,uVar5,(OperandList *)&local_f8);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_f8)
    ;
    local_108 = &(this->id_to_value_)._M_h;
    for (uVar4 = 0; uVar3 = Instruction::NumInOperands(inst), uVar4 < uVar3; uVar4 = uVar4 + 1) {
      pOVar10 = Instruction::GetInOperand(inst,uVar4);
      bVar2 = spvIsIdType(pOVar10->type);
      if (bVar2) {
        ppuVar1 = (uint **)(pOVar10->words).large_data_._M_t.
                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl;
        ppuVar14 = &(pOVar10->words).small_data_;
        if (ppuVar1 != (uint **)0x0) {
          ppuVar14 = ppuVar1;
        }
        id_value = **ppuVar14;
        iVar11 = std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(local_108,&id_value);
        if (iVar11.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur != (__node_type *)0x0) {
          id_value = *(uint *)((long)iVar11.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                     ._M_cur + 0xc) | 0x80000000;
        }
        sVar8 = pOVar10->type;
        init_list._M_len = 1;
        init_list._M_array = &local_fc;
        local_fc = id_value;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
        local_f8.type = sVar8;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_f8.words,&local_58);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>(&value_ins.operands_,&local_f8);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_f8.words);
        this_02 = &local_58;
      }
      else {
        local_f8.type = pOVar10->type;
        this_02 = &local_f8.words;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(this_02,&pOVar10->words);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>(&value_ins.operands_,&local_f8);
      }
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(this_02);
    }
    iVar12 = std::
             _Hashtable<spvtools::opt::Instruction,_std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::Instruction,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::ComputeSameValue,_spvtools::opt::ValueTableHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<spvtools::opt::Instruction,_std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::Instruction,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::ComputeSameValue,_spvtools::opt::ValueTableHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)this,&value_ins);
    if (iVar12.
        super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_true>.
        _M_cur == (__node_type *)0x0) {
      uVar3 = this->next_value_number_;
      this->next_value_number_ = uVar3 + 1;
      sVar8 = Instruction::result_id(inst);
      local_f8.type = sVar8;
      pmVar9 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)local_108,&local_f8.type);
      *pmVar9 = uVar3;
      puVar13 = std::__detail::
                _Map_base<spvtools::opt::Instruction,_std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::Instruction,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::ComputeSameValue,_spvtools::opt::ValueTableHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<spvtools::opt::Instruction,_std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::Instruction,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::ComputeSameValue,_spvtools::opt::ValueTableHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this,&value_ins);
    }
    else {
      sVar8 = Instruction::result_id
                        ((Instruction *)
                         ((long)iVar12.
                                super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_true>
                                ._M_cur + 8));
      this_00 = local_108;
      local_f8.type = sVar8;
      pmVar9 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)local_108,&local_f8.type);
      uVar3 = *pmVar9;
      local_f8.type = Instruction::result_id(inst);
      puVar13 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_00,&local_f8.type);
    }
    *puVar13 = uVar3;
    Instruction::~Instruction(&value_ins);
  }
  return uVar3;
}

Assistant:

uint32_t ValueNumberTable::AssignValueNumber(Instruction* inst) {
  // If it already has a value return that.
  uint32_t value = GetValueNumber(inst);
  if (value != 0) {
    return value;
  }

  // If the instruction has other side effects, then it must
  // have its own value number.
  // OpSampledImage and OpImage must remain in the same basic block in which
  // they are used, because of this we will assign each one it own value number.
  if (!context()->IsCombinatorInstruction(inst) &&
      !inst->IsCommonDebugInstr()) {
    value = TakeNextValueNumber();
    id_to_value_[inst->result_id()] = value;
    return value;
  }

  switch (inst->opcode()) {
    case spv::Op::OpSampledImage:
    case spv::Op::OpImage:
    case spv::Op::OpVariable:
      value = TakeNextValueNumber();
      id_to_value_[inst->result_id()] = value;
      return value;
    default:
      break;
  }

  // If it is a load from memory that can be modified, we have to assume the
  // memory has been modified, so we give it a new value number.
  //
  // Note that this test will also handle volatile loads because they are not
  // read only.  However, if this is ever relaxed because we analyze stores, we
  // will have to add a new case for volatile loads.
  if (inst->IsLoad() && !inst->IsReadOnlyLoad()) {
    value = TakeNextValueNumber();
    id_to_value_[inst->result_id()] = value;
    return value;
  }

  analysis::DecorationManager* dec_mgr = context()->get_decoration_mgr();

  // When we copy an object, the value numbers should be the same.
  if (inst->opcode() == spv::Op::OpCopyObject &&
      dec_mgr->HaveTheSameDecorations(inst->result_id(),
                                      inst->GetSingleWordInOperand(0))) {
    value = GetValueNumber(inst->GetSingleWordInOperand(0));
    if (value != 0) {
      id_to_value_[inst->result_id()] = value;
      return value;
    }
  }

  // Phi nodes are a type of copy.  If all of the inputs have the same value
  // number, then we can assign the result of the phi the same value number.
  if (inst->opcode() == spv::Op::OpPhi && inst->NumInOperands() > 0 &&
      dec_mgr->HaveTheSameDecorations(inst->result_id(),
                                      inst->GetSingleWordInOperand(0))) {
    value = GetValueNumber(inst->GetSingleWordInOperand(0));
    if (value != 0) {
      for (uint32_t op = 2; op < inst->NumInOperands(); op += 2) {
        if (value != GetValueNumber(inst->GetSingleWordInOperand(op))) {
          value = 0;
          break;
        }
      }
      if (value != 0) {
        id_to_value_[inst->result_id()] = value;
        return value;
      }
    }
  }

  // Replace all of the operands by their value number.  The sign bit will be
  // set to distinguish between an id and a value number.
  Instruction value_ins(context(), inst->opcode(), inst->type_id(),
                        inst->result_id(), {});
  for (uint32_t o = 0; o < inst->NumInOperands(); ++o) {
    const Operand& op = inst->GetInOperand(o);
    if (spvIsIdType(op.type)) {
      uint32_t id_value = op.words[0];
      auto use_id_to_val = id_to_value_.find(id_value);
      if (use_id_to_val != id_to_value_.end()) {
        id_value = (1 << 31) | use_id_to_val->second;
      }
      value_ins.AddOperand(Operand(op.type, {id_value}));
    } else {
      value_ins.AddOperand(Operand(op.type, op.words));
    }
  }

  // TODO: Implement a normal form for opcodes that commute like integer
  // addition.  This will let us know that a+b is the same value as b+a.

  // Otherwise, we check if this value has been computed before.
  auto value_iterator = instruction_to_value_.find(value_ins);
  if (value_iterator != instruction_to_value_.end()) {
    value = id_to_value_[value_iterator->first.result_id()];
    id_to_value_[inst->result_id()] = value;
    return value;
  }

  // If not, assign it a new value number.
  value = TakeNextValueNumber();
  id_to_value_[inst->result_id()] = value;
  instruction_to_value_[value_ins] = value;
  return value;
}